

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void __thiscall
server_metrics::on_decoded
          (server_metrics *this,vector<server_slot,_std::allocator<server_slot>_> *slots)

{
  bool bVar1;
  vector<server_slot,_std::allocator<server_slot>_> *in_RDI;
  server_slot *slot;
  const_iterator __end1;
  const_iterator __begin1;
  vector<server_slot,_std::allocator<server_slot>_> *__range1;
  reference in_stack_ffffffffffffffd0;
  __normal_iterator<const_server_slot_*,_std::vector<server_slot,_std::allocator<server_slot>_>_>
  local_20 [4];
  
  in_RDI[3].super__Vector_base<server_slot,_std::allocator<server_slot>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&(in_RDI[3].super__Vector_base<server_slot,_std::allocator<server_slot>_>.
                         _M_impl.super__Vector_impl_data._M_start)->id + 1);
  local_20[0]._M_current =
       (server_slot *)
       httplib::detail::std::vector<server_slot,_std::allocator<server_slot>_>::begin(in_RDI);
  httplib::detail::std::vector<server_slot,_std::allocator<server_slot>_>::end(in_RDI);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_server_slot_*,_std::vector<server_slot,_std::allocator<server_slot>_>_>
                             *)in_stack_ffffffffffffffd0,
                            (__normal_iterator<const_server_slot_*,_std::vector<server_slot,_std::allocator<server_slot>_>_>
                             *)in_RDI), bVar1) {
    in_stack_ffffffffffffffd0 =
         __gnu_cxx::
         __normal_iterator<const_server_slot_*,_std::vector<server_slot,_std::allocator<server_slot>_>_>
         ::operator*(local_20);
    bVar1 = server_slot::is_processing(in_stack_ffffffffffffffd0);
    if (bVar1) {
      in_RDI[3].super__Vector_base<server_slot,_std::allocator<server_slot>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)((long)&(in_RDI[3].super__Vector_base<server_slot,_std::allocator<server_slot>_>
                             ._M_impl.super__Vector_impl_data._M_finish)->id + 1);
    }
    __gnu_cxx::
    __normal_iterator<const_server_slot_*,_std::vector<server_slot,_std::allocator<server_slot>_>_>
    ::operator++(local_20);
  }
  return;
}

Assistant:

void on_decoded(const std::vector<server_slot> & slots) {
        n_decode_total++;
        for (const auto & slot : slots) {
            if (slot.is_processing()) {
                n_busy_slots_total++;
            }
        }
    }